

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_SubDFace::ControlNetCenterPoint(ON_3dPoint *__return_storage_ptr__,ON_SubDFace *this)

{
  double dVar1;
  double c;
  ON_3dVector local_58;
  ON_SubDVertex *local_40;
  ON_SubDVertex *v;
  ON_SubDEdgePtr *pOStack_30;
  unsigned_short fvi;
  ON_SubDEdgePtr *eptr;
  ON_3dPoint center;
  ON_SubDFace *this_local;
  
  if (this->m_edge_count < 3) {
    __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
    __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  }
  else {
    center.z = (double)this;
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&eptr,0.0,0.0,0.0);
    pOStack_30 = this->m_edge4;
    for (v._6_2_ = 0; v._6_2_ < this->m_edge_count; v._6_2_ = v._6_2_ + 1) {
      if ((v._6_2_ == 4) && (pOStack_30 = this->m_edgex, pOStack_30 == (ON_SubDEdgePtr *)0x0)) {
        __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
        __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
        __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
        return __return_storage_ptr__;
      }
      local_40 = ON_SubDEdgePtr::RelativeVertex(pOStack_30,0);
      if (local_40 == (ON_SubDVertex *)0x0) {
        __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
        __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
        __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
        return __return_storage_ptr__;
      }
      ON_SubDVertex::ControlNetPoint((ON_3dPoint *)&c,local_40);
      ON_3dVector::ON_3dVector(&local_58,(ON_3dPoint *)&c);
      ON_3dPoint::operator+=((ON_3dPoint *)&eptr,&local_58);
      pOStack_30 = pOStack_30 + 1;
    }
    dVar1 = (double)this->m_edge_count;
    __return_storage_ptr__->x = (double)eptr / dVar1;
    __return_storage_ptr__->y = center.x / dVar1;
    __return_storage_ptr__->z = center.y / dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDFace::ControlNetCenterPoint() const
{
  if (m_edge_count < 3)
    return ON_3dPoint::NanPoint;
  ON_3dPoint center(0.0, 0.0, 0.0);
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fvi = 0; fvi < m_edge_count; ++fvi, ++eptr)
  {
    if (4 == fvi)
    {
      eptr = m_edgex;
      if ( nullptr == eptr)
        return ON_3dPoint::NanPoint;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if ( nullptr == v)
      return ON_3dPoint::NanPoint;
    center += v->ControlNetPoint();
  }
  const double c = (double)m_edge_count;
  center.x /= c;
  center.y /= c;
  center.z /= c;
  return center;
}